

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JoystickImpl.cpp
# Opt level: O1

uint anon_unknown.dwarf_1388ad::getUdevAttributeUint(udev_device *udevDevice,string *attributeName)

{
  uint uVar1;
  char *__nptr;
  ulong uVar2;
  
  __nptr = (char *)udev_device_get_property_value();
  if (__nptr == (char *)0x0) {
    uVar1 = 0;
  }
  else {
    uVar2 = strtoul(__nptr,(char **)0x0,0x10);
    uVar1 = (uint)uVar2;
  }
  return uVar1;
}

Assistant:

unsigned int getUdevAttributeUint(udev_device* udevDevice, const std::string& attributeName)
    {
        if (!udevDevice)
            return 0;

        const char* attribute = getUdevAttribute(udevDevice, attributeName);
        unsigned int value = 0;

        if (attribute)
            value = static_cast<unsigned int>(std::strtoul(attribute, NULL, 16));

        return value;
    }